

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_Boolean
HTS_get_token_from_string_with_separator(char *str,size_t *index,char *buff,char separator)

{
  size_t len;
  char c;
  char separator_local;
  char *buff_local;
  size_t *index_local;
  char *str_local;
  HTS_Boolean local_1;
  
  len = 0;
  if (str == (char *)0x0) {
    local_1 = '\0';
  }
  else {
    c = str[*index];
    if (c == '\0') {
      local_1 = '\0';
    }
    else {
      while (c == separator) {
        if (c == '\0') {
          return '\0';
        }
        *index = *index + 1;
        c = str[*index];
      }
      while (c != separator && c != '\0') {
        buff[len] = c;
        *index = *index + 1;
        len = len + 1;
        c = str[*index];
      }
      if (c != '\0') {
        *index = *index + 1;
      }
      buff[len] = '\0';
      if (len == 0) {
        local_1 = '\0';
      }
      else {
        local_1 = '\x01';
      }
    }
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_get_token_from_string_with_separator(const char *str, size_t * index, char *buff, char separator)
{
   char c;
   size_t len = 0;

   if (str == NULL)
      return FALSE;

   c = str[(*index)];
   if (c == '\0')
      return FALSE;
   while (c == separator) {
      if (c == '\0')
         return FALSE;
      (*index)++;
      c = str[(*index)];
   }
   while (c != separator && c != '\0') {
      buff[len++] = c;
      (*index)++;
      c = str[(*index)];
   }
   if (c != '\0')
      (*index)++;

   buff[len] = '\0';

   if (len > 0)
      return TRUE;
   else
      return FALSE;
}